

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall helics::Publication::publish(Publication *this,complex<double> val)

{
  bool bVar1;
  SmallBuffer *in_RDI;
  SmallBuffer db;
  bool doPublish;
  complex<double> *in_stack_00000180;
  DataType in_stack_0000018c;
  SmallBuffer *this_00;
  double in_stack_ffffffffffffff38;
  complex<double> *in_stack_ffffffffffffff40;
  data_view *in_stack_ffffffffffffff50;
  Publication *in_stack_ffffffffffffff58;
  ValueFederate *in_stack_ffffffffffffff60;
  SmallBuffer local_80;
  byte local_19;
  
  local_19 = *(long *)((long)((_Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                               *)(in_RDI->buffer)._M_elems + 1) + 8) != 0;
  if ((in_RDI->userKey & 1) != 0) {
    bVar1 = changeDetected((defV *)in_RDI,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (bVar1) {
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)in_stack_ffffffffffffff50,(complex<double> *)in_RDI);
    }
    else {
      local_19 = 0;
    }
  }
  if ((local_19 & 1) != 0) {
    this_00 = &local_80;
    typeConvert(in_stack_0000018c,in_stack_00000180);
    data_view::data_view(in_stack_ffffffffffffff50,in_RDI);
    helics::ValueFederate::publishBytes
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    data_view::~data_view((data_view *)0x2c4e4b);
    SmallBuffer::~SmallBuffer(this_00);
  }
  return;
}

Assistant:

void Publication::publish(std::complex<double> val)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, val, delta)) {
            prevValue = val;
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, val);
        fed->publishBytes(*this, db);
    }
}